

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O2

bool __thiscall lunasvg::Length::parse(Length *this,string_view input,LengthNegativeMode mode)

{
  char cVar1;
  bool bVar2;
  LengthUnits LVar3;
  size_t sStack_40;
  string_view local_38;
  float value;
  
  local_38._M_str = input._M_str;
  local_38._M_len = input._M_len;
  value = 0.0;
  stripLeadingAndTrailingSpaces(&local_38);
  bVar2 = parseNumber<float>(&local_38,&value);
  if ((!bVar2) || ((mode == Forbid && (value < 0.0)))) {
    return false;
  }
  if (local_38._M_len == 0) {
    this->m_value = value;
    this->m_units = None;
    return true;
  }
  cVar1 = *local_38._M_str;
  if (cVar1 == 'p') {
    if (local_38._M_len == 1) {
      return false;
    }
    cVar1 = local_38._M_str[1];
    if (cVar1 != 'x') {
      if (cVar1 == 't') {
        value = (value * 96.0) / 72.0;
      }
      else {
        if (cVar1 != 'c') {
          return false;
        }
        value = (value * 96.0) / 6.0;
      }
    }
LAB_0011c3b6:
    this->m_value = value;
    this->m_units = Px;
  }
  else {
    if (cVar1 == 'c') {
      if (local_38._M_len == 1) {
        return false;
      }
      if (local_38._M_str[1] != 'm') {
        return false;
      }
      value = (value * 96.0) / 2.54;
      goto LAB_0011c3b6;
    }
    if (cVar1 != 'e') {
      if (cVar1 == 'i') {
        if (local_38._M_len == 1) {
          return false;
        }
        if (local_38._M_str[1] != 'n') {
          return false;
        }
        value = value * 96.0;
      }
      else {
        if (cVar1 != 'm') {
          if (cVar1 != '%') {
            return false;
          }
          this->m_value = value;
          this->m_units = Percent;
          sStack_40 = 1;
          goto LAB_0011c3c0;
        }
        if (local_38._M_len == 1) {
          return false;
        }
        if (local_38._M_str[1] != 'm') {
          return false;
        }
        value = (value * 96.0) / 25.4;
      }
      goto LAB_0011c3b6;
    }
    if (local_38._M_len == 1) {
      return false;
    }
    if (local_38._M_str[1] == 'm') {
      LVar3 = Em;
    }
    else {
      if (local_38._M_str[1] != 'x') {
        return false;
      }
      LVar3 = Ex;
    }
    this->m_units = LVar3;
    this->m_value = value;
  }
  sStack_40 = 2;
LAB_0011c3c0:
  return local_38._M_len == sStack_40;
}

Assistant:

bool Length::parse(std::string_view input, LengthNegativeMode mode)
{
    float value = 0.f;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value))
        return false;
    if(value < 0.f && mode == LengthNegativeMode::Forbid)
        return false;
    if(input.empty()) {
        m_value = value;
        m_units = LengthUnits::None;
        return true;
    }

    constexpr auto dpi = 96.f;
    switch(input.front()) {
    case '%':
        m_value = value;
        m_units = LengthUnits::Percent;
        input.remove_prefix(1);
        break;
    case 'p':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'x')
            m_value = value;
        else if(input.front() == 'c')
            m_value = value * dpi / 6.f;
        else if(input.front() == 't')
            m_value = value * dpi / 72.f;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'i':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'n')
            m_value = value * dpi;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'c':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'm')
            m_value = value * dpi / 2.54f;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'm':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'm')
            m_value = value * dpi / 25.4f;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'e':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'm')
            m_units = LengthUnits::Em;
        else if(input.front() == 'x')
            m_units = LengthUnits::Ex;
        else
            return false;
        m_value = value;
        input.remove_prefix(1);
        break;
    default:
        return false;
    }

    return input.empty();
}